

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O1

void __thiscall
google::FlagRegisterer::FlagRegisterer
          (FlagRegisterer *this,char *name,char *type,char *help,char *filename,
          void *current_storage,void *defvalue_storage)

{
  Mutex *pMVar1;
  size_t *psVar2;
  _Rb_tree_header *p_Var3;
  ulong uVar4;
  undefined1 auVar5 [16];
  _Rb_tree_node_base *p_Var6;
  byte bVar7;
  uint uVar8;
  int iVar9;
  char *pcVar10;
  _Base_ptr p_Var11;
  FlagValue *this_00;
  _Base_ptr p_Var12;
  FlagRegistry *pFVar13;
  _Rb_tree_node_base *p_Var14;
  _Rb_tree_node_base *p_Var15;
  _Rb_tree_node_base *p_Var16;
  _Base_ptr p_Var17;
  bool bVar18;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar19;
  
  pcVar10 = strchr(type,0x3a);
  if (pcVar10 != (char *)0x0) {
    pcVar10 = strrchr(type,0x3a);
    type = pcVar10 + 1;
  }
  p_Var11 = (_Base_ptr)operator_new(0x10);
  anon_unknown_1::FlagValue::FlagValue((FlagValue *)p_Var11,current_storage,type,false);
  this_00 = (FlagValue *)operator_new(0x10);
  anon_unknown_1::FlagValue::FlagValue(this_00,defvalue_storage,type,false);
  p_Var17 = (_Base_ptr)0x19b57b;
  if (help != (char *)0x0) {
    p_Var17 = (_Base_ptr)help;
  }
  p_Var12 = (_Base_ptr)operator_new(0x38);
  *(char **)p_Var12 = name;
  p_Var12->_M_parent = p_Var17;
  p_Var12->_M_left = (_Base_ptr)filename;
  *(undefined1 *)&p_Var12->_M_right = 0;
  *(FlagValue **)(p_Var12 + 1) = this_00;
  p_Var12[1]._M_parent = p_Var11;
  p_Var12[1]._M_left = (_Base_ptr)0x0;
  pFVar13 = anon_unknown_1::FlagRegistry::GlobalRegistry();
  pMVar1 = &pFVar13->lock_;
  iVar9 = pMVar1->mutex_;
  pMVar1->mutex_ = pMVar1->mutex_ + -1;
  if (iVar9 != 0) {
    __assert_fail("--mutex_ == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/mutex.h"
                  ,0xde,"void gflags_mutex_namespace::Mutex::Lock()");
  }
  pcVar10 = *(char **)p_Var12;
  p_Var14 = (_Rb_tree_node_base *)operator_new(0x30);
  *(char **)(p_Var14 + 1) = pcVar10;
  p_Var14[1]._M_parent = p_Var12;
  p_Var3 = &(pFVar13->flags_)._M_t._M_impl.super__Rb_tree_header;
  p_Var17 = (pFVar13->flags_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var17 == (_Base_ptr)0x0) {
    bVar7 = 1;
    p_Var16 = &p_Var3->_M_header;
  }
  else {
    do {
      p_Var16 = p_Var17;
      uVar8 = strcmp(pcVar10,*(char **)(p_Var16 + 1));
      p_Var17 = (&p_Var16->_M_left)[~uVar8 >> 0x1f];
    } while (p_Var17 != (_Base_ptr)0x0);
    bVar7 = (byte)(uVar8 >> 0x1f);
  }
  p_Var15 = p_Var16;
  if (bVar7 == 0) {
LAB_0018f7c4:
    iVar9 = strcmp(*(char **)(p_Var15 + 1),pcVar10);
    if (-1 < iVar9) {
      p_Var17 = p_Var15;
      p_Var16 = (_Rb_tree_node_base *)0x0;
    }
  }
  else if (p_Var16 != (pFVar13->flags_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
    p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var16);
    goto LAB_0018f7c4;
  }
  if (p_Var16 == (_Rb_tree_node_base *)0x0) {
    operator_delete(p_Var14);
  }
  else {
    bVar18 = true;
    if ((p_Var17 == (_Base_ptr)0x0) && (p_Var3 != (_Rb_tree_header *)p_Var16)) {
      iVar9 = strcmp(pcVar10,*(char **)(p_Var16 + 1));
      bVar18 = SUB41((uint)iVar9 >> 0x1f,0);
    }
    std::_Rb_tree_insert_and_rebalance(bVar18,p_Var14,p_Var16,&p_Var3->_M_header);
    psVar2 = &(pFVar13->flags_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    *psVar2 = *psVar2 + 1;
    p_Var17 = p_Var14;
  }
  if (p_Var16 == (_Rb_tree_node_base *)0x0) {
    p_Var17 = (p_Var17[1]._M_parent)->_M_left;
    p_Var11 = p_Var12->_M_left;
    iVar9 = strcmp((char *)p_Var17,(char *)p_Var11);
    if (iVar9 == 0) {
      pcVar10 = 
      "ERROR: something wrong with flag \'%s\' in file \'%s\'.  One possibility: file \'%s\' is being linked both statically and dynamically into this executable.\n"
      ;
      p_Var17 = p_Var11;
    }
    else {
      pcVar10 = "ERROR: flag \'%s\' was defined more than once (in files \'%s\' and \'%s\').\n";
    }
    anon_unknown_1::ReportError(DIE,pcVar10,*(undefined8 *)p_Var12,p_Var17,p_Var11);
  }
  p_Var17 = p_Var12[1]._M_parent;
  p_Var11 = (pFVar13->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = &(pFVar13->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header;
  p_Var14 = &p_Var3->_M_header;
  if (p_Var11 != (_Base_ptr)0x0) {
    do {
      if (*(ulong *)(p_Var11 + 1) >= *(ulong *)p_Var17) {
        p_Var14 = p_Var11;
      }
      p_Var11 = (&p_Var11->_M_left)[*(ulong *)(p_Var11 + 1) < *(ulong *)p_Var17];
    } while (p_Var11 != (_Base_ptr)0x0);
  }
  if (((_Rb_tree_header *)p_Var14 != p_Var3) && (*(ulong *)(p_Var14 + 1) <= *(ulong *)p_Var17))
  goto LAB_0018f99f;
  p_Var16 = (_Rb_tree_node_base *)operator_new(0x30);
  uVar4 = *(ulong *)p_Var17;
  *(ulong *)(p_Var16 + 1) = uVar4;
  p_Var16[1]._M_parent = (_Base_ptr)0x0;
  if ((_Rb_tree_header *)p_Var14 == p_Var3) {
    if (((pFVar13->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
       (p_Var17 = (pFVar13->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
       uVar4 <= *(ulong *)(p_Var17 + 1))) {
LAB_0018f94f:
      pVar19 = std::
               _Rb_tree<const_void_*,_std::pair<const_void_*const,_google::(anonymous_namespace)::CommandLineFlag_*>,_std::_Select1st<std::pair<const_void_*const,_google::(anonymous_namespace)::CommandLineFlag_*>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_google::(anonymous_namespace)::CommandLineFlag_*>_>_>
               ::_M_get_insert_unique_pos(&(pFVar13->flags_by_ptr_)._M_t,(key_type *)(p_Var16 + 1));
    }
    else {
LAB_0018f93d:
      auVar5._8_8_ = 0;
      auVar5._0_8_ = p_Var17;
      pVar19 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar5 << 0x40);
    }
  }
  else if (uVar4 < *(ulong *)(p_Var14 + 1)) {
    p_Var17 = (pFVar13->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    pVar19.second = p_Var17;
    pVar19.first = p_Var17;
    if (p_Var17 != p_Var14) {
      p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var14);
      if (uVar4 <= *(ulong *)(p_Var15 + 1)) goto LAB_0018f94f;
      p_Var6 = p_Var14;
      if (p_Var15->_M_right == (_Base_ptr)0x0) {
        p_Var14 = p_Var15;
        p_Var6 = (_Rb_tree_node_base *)0x0;
      }
      pVar19.second = p_Var14;
      pVar19.first = p_Var6;
    }
  }
  else if (*(ulong *)(p_Var14 + 1) < uVar4) {
    p_Var17 = (pFVar13->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    if (p_Var17 == p_Var14) goto LAB_0018f93d;
    p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
    if (*(ulong *)(p_Var15 + 1) <= uVar4) goto LAB_0018f94f;
    p_Var6 = p_Var15;
    if (p_Var14->_M_right == (_Base_ptr)0x0) {
      p_Var15 = p_Var14;
      p_Var6 = (_Rb_tree_node_base *)0x0;
    }
    pVar19.second = p_Var15;
    pVar19.first = p_Var6;
  }
  else {
    pVar19.second = (_Rb_tree_node_base *)0x0;
    pVar19.first = p_Var14;
  }
  p_Var15 = pVar19.second;
  p_Var14 = pVar19.first;
  if (p_Var15 == (_Rb_tree_node_base *)0x0) {
    operator_delete(p_Var16);
  }
  else {
    bVar18 = true;
    if ((p_Var14 == (_Rb_tree_node_base *)0x0) && (p_Var3 != (_Rb_tree_header *)p_Var15)) {
      bVar18 = uVar4 < *(ulong *)(p_Var15 + 1);
    }
    std::_Rb_tree_insert_and_rebalance(bVar18,p_Var16,p_Var15,&p_Var3->_M_header);
    psVar2 = &(pFVar13->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    *psVar2 = *psVar2 + 1;
    p_Var14 = p_Var16;
  }
LAB_0018f99f:
  p_Var14[1]._M_parent = p_Var12;
  pMVar1 = &pFVar13->lock_;
  pMVar1->mutex_ = pMVar1->mutex_ + 1;
  if (pMVar1->mutex_ == 0) {
    return;
  }
  __assert_fail("mutex_++ == -1",
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/mutex.h"
                ,0xdf,"void gflags_mutex_namespace::Mutex::Unlock()");
}

Assistant:

FlagRegisterer::FlagRegisterer(const char* name, const char* type,
                               const char* help, const char* filename,
                               void* current_storage, void* defvalue_storage) {
  if (help == NULL)
    help = "";
  // FlagValue expects the type-name to not include any namespace
  // components, so we get rid of those, if any.
  if (strchr(type, ':'))
    type = strrchr(type, ':') + 1;
  FlagValue* current = new FlagValue(current_storage, type, false);
  FlagValue* defvalue = new FlagValue(defvalue_storage, type, false);
  // Importantly, flag_ will never be deleted, so storage is always good.
  CommandLineFlag* flag = new CommandLineFlag(name, help, filename,
                                              current, defvalue);
  FlagRegistry::GlobalRegistry()->RegisterFlag(flag);   // default registry
}